

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

bool __thiscall ON_PolyEdgeSegment::ReversedTrimDir(ON_PolyEdgeSegment *this)

{
  bool local_11;
  bool rc;
  ON_PolyEdgeSegment *this_local;
  
  local_11 = false;
  if (((this->m_trim != (ON_BrepTrim *)0x0) && (this->m_edge != (ON_BrepEdge *)0x0)) &&
     (local_11 = ReversedEdgeDir(this), (this->m_trim->m_bRev3d & 1U) != 0)) {
    local_11 = (bool)((local_11 ^ 0xffU) & 1);
  }
  return local_11;
}

Assistant:

bool ON_PolyEdgeSegment::ReversedTrimDir() const
{
  bool rc = false;
  if ( m_trim && m_edge )
  {
    rc = ReversedEdgeDir();
    if ( m_trim->m_bRev3d )
      rc = !rc;
  }
  return rc;
}